

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O3

void M3x3_RotateZ(double (*input) [3],double degrees,double (*result) [3])

{
  int i;
  long lVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  int k;
  long lVar6;
  byte bVar7;
  double dVar8;
  double temp [3] [3];
  double transformationmatrix [3] [3];
  double local_b8 [10];
  double local_68 [4];
  double local_48;
  
  bVar7 = 0;
  pdVar4 = local_68;
  lVar1 = 9;
  pdVar2 = IdentityMatrix[0];
  pdVar5 = pdVar4;
  for (; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar5 = *pdVar2;
    pdVar2 = pdVar2 + 1;
    pdVar5 = pdVar5 + 1;
  }
  dVar8 = cos(degrees * 0.017453292519943295);
  local_68[3] = sin(degrees * 0.017453292519943295);
  local_68[0] = dVar8;
  local_68[1] = -local_68[3];
  local_48 = dVar8;
  lVar1 = 0;
  do {
    lVar3 = 0;
    pdVar2 = *input;
    do {
      dVar8 = 0.0;
      lVar6 = 0;
      pdVar5 = pdVar2;
      do {
        dVar8 = dVar8 + pdVar4[lVar6] * (*(double (*) [3])pdVar5)[0];
        lVar6 = lVar6 + 1;
        pdVar5 = (double *)((long)pdVar5 + 0x18);
      } while (lVar6 != 3);
      local_b8[lVar1 * 3 + lVar3] = dVar8;
      lVar3 = lVar3 + 1;
      pdVar2 = pdVar2 + 1;
    } while (lVar3 != 3);
    lVar1 = lVar1 + 1;
    pdVar4 = pdVar4 + 3;
  } while (lVar1 != 3);
  pdVar4 = local_b8;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    (*result)[0] = *pdVar4;
    pdVar4 = pdVar4 + (ulong)bVar7 * -2 + 1;
    result = (double (*) [3])((long)result + ((ulong)bVar7 * -2 + 1) * 8);
  }
  return;
}

Assistant:

void M3x3_RotateZ(double input[][3], double degrees, double result[3][3])
{
    double transformationmatrix[3][3];
    double sinvalue, cosvalue, radians;

    M3x3_LoadIdentity(transformationmatrix);

    radians = degrees * (M_PI/180.0);
    cosvalue = cos(radians);
    sinvalue = sin(radians);

    transformationmatrix[0][0] =  cosvalue;
    transformationmatrix[0][1] = -sinvalue;
    transformationmatrix[1][0] =  sinvalue;
    transformationmatrix[1][1] =  cosvalue;

    M3x3_MulMatrix(transformationmatrix, input, result);
}